

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::DescriptorPoolExtensionFinder::Find
          (DescriptorPoolExtensionFinder *this,int number,ExtensionInfo *output)

{
  long *plVar1;
  bool bVar2;
  Type TVar3;
  CppType CVar4;
  FieldDescriptor *this_00;
  Descriptor *pDVar5;
  undefined8 uVar6;
  LogMessage *this_01;
  EnumDescriptor *pEVar7;
  undefined1 *in_RDX;
  long in_RDI;
  FieldDescriptor *extension;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  LogMessage *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  LogLevel_conflict level;
  LogMessage *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffffac;
  Descriptor *in_stack_ffffffffffffffb0;
  DescriptorPool *in_stack_ffffffffffffffb8;
  bool local_1;
  
  level = (LogLevel_conflict)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  this_00 = DescriptorPool::FindExtensionByNumber
                      (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac
                      );
  if (this_00 == (FieldDescriptor *)0x0) {
    local_1 = false;
  }
  else {
    TVar3 = FieldDescriptor::type((FieldDescriptor *)in_stack_ffffffffffffff60);
    *in_RDX = (char)TVar3;
    bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)0x55c685);
    in_RDX[1] = bVar2;
    FieldDescriptor::options(this_00);
    bVar2 = FieldOptions::packed((FieldOptions *)0x55c6aa);
    in_RDX[2] = bVar2;
    *(FieldDescriptor **)(in_RDX + 0x18) = this_00;
    CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)0x55c6db);
    if (CVar4 == CPPTYPE_MESSAGE) {
      plVar1 = *(long **)(in_RDI + 0x10);
      pDVar5 = FieldDescriptor::message_type((FieldDescriptor *)in_stack_ffffffffffffff50);
      uVar6 = (**(code **)(*plVar1 + 0x10))(plVar1,pDVar5);
      *(undefined8 *)(in_RDX + 8) = uVar6;
      if (*(long *)(in_RDX + 8) == 0) {
        LogMessage::LogMessage
                  (in_stack_ffffffffffffff60,level,(char *)in_stack_ffffffffffffff50,
                   in_stack_ffffffffffffff4c);
        LogMessage::operator<<
                  (in_stack_ffffffffffffff50,
                   (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        LogMessage::operator<<
                  (in_stack_ffffffffffffff50,
                   (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        FieldDescriptor::full_name_abi_cxx11_(this_00);
        this_01 = LogMessage::operator<<
                            (in_stack_ffffffffffffff50,
                             (string *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                            );
        LogFinisher::operator=
                  ((LogFinisher *)this_01,
                   (LogMessage *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        LogMessage::~LogMessage((LogMessage *)0x55c7dd);
      }
    }
    else {
      CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)0x55c80f);
      if (CVar4 == CPPTYPE_ENUM) {
        *(code **)(in_RDX + 8) = ValidateEnumUsingDescriptor;
        pEVar7 = FieldDescriptor::enum_type((FieldDescriptor *)in_stack_ffffffffffffff50);
        *(EnumDescriptor **)(in_RDX + 0x10) = pEVar7;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool DescriptorPoolExtensionFinder::Find(int number, ExtensionInfo* output) {
  const FieldDescriptor* extension =
      pool_->FindExtensionByNumber(containing_type_, number);
  if (extension == NULL) {
    return false;
  } else {
    output->type = extension->type();
    output->is_repeated = extension->is_repeated();
    output->is_packed = extension->options().packed();
    output->descriptor = extension;
    if (extension->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      output->message_info.prototype =
          factory_->GetPrototype(extension->message_type());
      GOOGLE_CHECK(output->message_info.prototype != nullptr)
          << "Extension factory's GetPrototype() returned NULL for extension: "
          << extension->full_name();
    } else if (extension->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      output->enum_validity_check.func = ValidateEnumUsingDescriptor;
      output->enum_validity_check.arg = extension->enum_type();
    }

    return true;
  }
}